

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

Vec_Int_t *
Acb_DerivePatchSupport
          (Cnf_Dat_t *pCnf,int iTar,int nTargets,int nCoDivs,Vec_Int_t *vDivs,Acb_Ntk_t *pNtkF,
          Vec_Int_t *vSuppOld,int TimeOut)

{
  lit *end;
  bool bVar1;
  Vec_Int_t *pVec;
  sat_solver *s;
  int iVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  sat_solver *psVar5;
  abctime aVar6;
  abctime aVar7;
  Vec_Int_t *vWeights;
  Vec_Int_t *pVVar8;
  long lVar9;
  ulong uVar10;
  abctime time;
  abctime time_00;
  abctime time_01;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int Lit;
  timespec ts;
  int pLits [2];
  lit local_b4;
  timespec local_b0;
  ulong local_a0;
  Vec_Int_t *local_98;
  uint local_90;
  int local_8c;
  long local_88;
  ulong local_80;
  uint local_78;
  int local_74;
  long local_70;
  ulong local_68;
  sat_solver *local_60;
  ulong local_58;
  Vec_Int_t *local_50;
  Acb_Ntk_t *local_48;
  ulong local_40;
  ulong local_38;
  
  local_50 = vDivs;
  local_48 = pNtkF;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  piVar4 = (int *)malloc(400);
  pVVar3->pArray = piVar4;
  iVar14 = pCnf->nVars;
  psVar5 = sat_solver_new();
  local_a0 = (ulong)(uint)nCoDivs;
  sat_solver_setnvars(psVar5,nCoDivs + pCnf->nVars * 2);
  lVar9 = 0;
  while (lVar9 < pCnf->nClauses) {
    iVar2 = sat_solver_addclause(psVar5,pCnf->pClauses[lVar9],pCnf->pClauses[lVar9 + 1]);
    lVar9 = lVar9 + 1;
    if (iVar2 == 0) {
      return (Vec_Int_t *)0x0;
    }
  }
  local_b4 = 2;
  local_98 = pVVar3;
  iVar2 = sat_solver_addclause(psVar5,&local_b4,(lit *)&local_b0);
  if (iVar2 == 0) {
    return (Vec_Int_t *)0x0;
  }
  pCnf->pMan = (Aig_Man_t *)0x0;
  Cnf_DataLift(pCnf,pCnf->nVars);
  lVar9 = 0;
  while (lVar9 < pCnf->nClauses) {
    iVar2 = sat_solver_addclause(psVar5,pCnf->pClauses[lVar9],pCnf->pClauses[lVar9 + 1]);
    lVar9 = lVar9 + 1;
    if (iVar2 == 0) {
      return (Vec_Int_t *)0x0;
    }
  }
  Cnf_DataLift(pCnf,-pCnf->nVars);
  if (-2 < pCnf->nVars) {
    local_b4 = pCnf->nVars * 2 + 2;
    iVar2 = sat_solver_addclause(psVar5,&local_b4,(lit *)&local_b0);
    if (iVar2 == 0) {
      return (Vec_Int_t *)0x0;
    }
    iVar14 = (iVar14 - nTargets) + iTar;
    if (-1 < iVar14) {
      local_b4 = iVar14 * 2 + 1;
      iVar2 = sat_solver_addclause(psVar5,&local_b4,(lit *)&local_b0);
      if (iVar2 == 0) {
        return (Vec_Int_t *)0x0;
      }
      iVar14 = iVar14 + pCnf->nVars;
      if (-1 < iVar14) {
        local_b4 = iVar14 * 2;
        iVar14 = sat_solver_addclause(psVar5,&local_b4,(lit *)&local_b0);
        if (iVar14 == 0) {
          return (Vec_Int_t *)0x0;
        }
        pVVar3 = local_98;
        if (0 < (int)local_a0) {
          iVar14 = clock_gettime(3,&local_b0);
          if (iVar14 < 0) {
            local_70 = 1;
          }
          else {
            lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                           SEXT816(CONCAT44(local_b0.tv_nsec._4_4_,(int)local_b0.tv_nsec)),8);
            local_70 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) +
                       CONCAT44(local_b0.tv_sec._4_4_,(int)local_b0.tv_sec) * -1000000;
          }
          local_80 = (ulong)(uint)pCnf->nVars;
          local_98->nSize = 0;
          lVar9 = 0;
          local_60 = psVar5;
          if ((vSuppOld != (Vec_Int_t *)0x0) && (0 < vSuppOld->nSize)) {
            lVar9 = 0;
            do {
              if (vSuppOld->pArray[lVar9] < -2) goto LAB_00397b42;
              iVar14 = vSuppOld->pArray[lVar9] + 2;
              iVar2 = pCnf->nVars + iVar14;
              uVar12 = iVar14 * 2;
              local_90 = uVar12;
              local_88 = lVar9;
              if (iVar2 < 0) goto LAB_00397b42;
              local_8c = iVar2 * 2 + 1;
              iVar14 = sat_solver_addclause(psVar5,(lit *)&local_90,(lit *)&local_88);
              if (iVar14 == 0) {
                puts("Unsat is detected earlier.");
                lVar9 = local_88;
                break;
              }
              local_8c = iVar2 * 2;
              local_90 = uVar12 | 1;
              iVar14 = sat_solver_addclause(psVar5,(lit *)&local_90,(lit *)&local_88);
              if (iVar14 == 0) {
                puts("Unsat is detected earlier.");
                lVar9 = local_88;
                break;
              }
              lVar9 = local_88 + 1;
            } while (lVar9 < vSuppOld->nSize);
          }
          s = local_60;
          if ((vSuppOld == (Vec_Int_t *)0x0) ||
             (bVar1 = true, pVVar3 = local_98, (int)lVar9 == vSuppOld->nSize)) {
            iVar14 = (int)local_80;
            uVar13 = (ulong)(uint)(iVar14 * 2);
            end = (lit *)((long)&local_b0.tv_nsec + 4);
            local_78 = 1;
            if (1 < (int)(uint)local_a0) {
              local_78 = (uint)local_a0;
            }
            local_80 = (ulong)(uint)(iVar14 << 2);
            local_58 = (ulong)(iVar14 * 4 + 1);
            uVar11 = 0;
            uVar10 = 0;
            local_68 = uVar13;
            do {
              iVar14 = (int)uVar10 + pCnf->nVars;
              uVar12 = iVar14 + 2;
              local_38 = uVar10;
              if ((int)((int)uVar10 + (int)uVar13 | uVar12) < 0) {
                __assert_fail("iVarA >= 0 && iVarB >= 0 && iVarC >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                              ,0x1a8,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
              }
              iVar2 = (int)uVar11;
              iVar15 = (int)local_58 + iVar2;
              local_b0.tv_sec._4_4_ = iVar2 + 5;
              local_a0 = CONCAT44(local_a0._4_4_,local_b0.tv_sec._4_4_);
              local_b0.tv_nsec._0_4_ = iVar14 + 3 + uVar12;
              local_88 = CONCAT44(local_88._4_4_,(int)local_b0.tv_nsec);
              local_b0.tv_sec._0_4_ = iVar15;
              iVar14 = sat_solver_addclause(s,(lit *)&local_b0,end);
              if (iVar14 == 0) {
                __assert_fail("Cid",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                              ,0x1ae,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
              }
              local_b0.tv_sec._0_4_ = iVar15;
              local_b0.tv_sec._4_4_ = iVar2 + 4;
              local_b0.tv_nsec._0_4_ = uVar12 * 2;
              local_74 = iVar15;
              iVar14 = sat_solver_addclause(s,(lit *)&local_b0,end);
              if (iVar14 == 0) {
                __assert_fail("Cid",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                              ,0x1b4,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
              }
              iVar15 = iVar2 + (int)local_80;
              local_b0.tv_sec._4_4_ = (int)local_a0;
              local_b0.tv_sec._0_4_ = iVar15;
              local_b0.tv_nsec._0_4_ = uVar12 * 2;
              local_40 = uVar11;
              iVar14 = sat_solver_addclause(s,(lit *)&local_b0,end);
              if (iVar14 == 0) {
                __assert_fail("Cid",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                              ,0x1ba,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
              }
              local_b0.tv_nsec._0_4_ = (undefined4)local_88;
              local_b0.tv_sec._0_4_ = iVar15;
              local_b0.tv_sec._4_4_ = iVar2 + 4;
              iVar2 = sat_solver_addclause(s,(lit *)&local_b0,end);
              uVar11 = local_40;
              uVar13 = local_68;
              pVec = local_98;
              iVar14 = (int)local_68;
              if (iVar2 == 0) {
                __assert_fail("Cid",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                              ,0x1c0,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
              }
              if (iVar14 < 0) goto LAB_00397b42;
              Vec_IntPush(local_98,local_74);
              uVar12 = (int)local_38 + 1;
              uVar10 = (ulong)uVar12;
              uVar11 = (ulong)((int)uVar11 + 2);
            } while (local_78 != uVar12);
            if (TimeOut != 0) {
              aVar6 = Abc_Clock();
              s->nRuntimeLimit = aVar6 + (long)TimeOut * 1000000;
            }
            iVar2 = sat_solver_solve(s,pVec->pArray,pVec->pArray + pVec->nSize,0,0,0,0);
            if (TimeOut != 0) {
              s->nRuntimeLimit = 0;
            }
            pVVar3 = pVec;
            psVar5 = s;
            if (iVar2 == -1) {
              printf("Proved that the problem has a solution.  ");
              aVar6 = Abc_Clock();
              Abc_PrintTime(0xa00e9c,(char *)(local_70 + aVar6),time);
              aVar6 = Abc_Clock();
              iVar2 = sat_solver_minimize_assumptions(s,pVec->pArray,pVec->nSize,0);
              if (pVec->nSize < iVar2) {
                __assert_fail("p->nSize >= nSizeNew",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
              }
              pVec->nSize = iVar2;
              qsort(pVec->pArray,(long)iVar2,4,Vec_IntSortCompare1);
              printf("Found one feasible set of %d divisors.  ",(ulong)(uint)pVec->nSize);
              aVar7 = Abc_Clock();
              Abc_PrintTime(0xa00e9c,(char *)(aVar7 - aVar6),time_00);
              if (0 < pVec->nSize) {
                local_a0 = Abc_Clock();
                pVVar3 = Vec_IntDup(pVec);
                vWeights = Acb_DeriveWeights(local_50,local_48);
                pVVar8 = Acb_FindSupport(s,iVar14,vWeights,pVec,TimeOut);
                Vec_IntFree(vWeights);
                Vec_IntFree(pVec);
                if (pVVar8 == (Vec_Int_t *)0x0) {
                  printf("Support minimization did not succeed.  ");
                }
                else {
                  Vec_IntFree(pVVar3);
                  printf("Minimized support to %d supp vars.  ",(ulong)(uint)pVVar8->nSize);
                  pVVar3 = pVVar8;
                }
                aVar6 = Abc_Clock();
                Abc_PrintTime(0xa00e9c,(char *)(aVar6 - local_a0),time_01);
                iVar14 = (int)local_68;
              }
              iVar2 = pVVar3->nSize;
              if (0 < iVar2) {
                piVar4 = pVVar3->pArray;
                lVar9 = 0;
                do {
                  uVar12 = piVar4[lVar9];
                  if ((int)uVar12 < 0) {
                    __assert_fail("Lit >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                  ,0x12f,"int Abc_Lit2Var(int)");
                  }
                  piVar4[lVar9] = (uVar12 >> 1) - iVar14;
                  lVar9 = lVar9 + 1;
                  iVar2 = pVVar3->nSize;
                } while (lVar9 < iVar2);
              }
              qsort(pVVar3->pArray,(long)iVar2,4,Vec_IntSortCompare1);
              bVar1 = true;
            }
            else if (iVar2 == 0) {
              bVar1 = false;
              printf("Support computation timed out after %d sec.\n",(ulong)(uint)TimeOut);
              sat_solver_delete(s);
              Vec_IntFree(pVec);
            }
            else {
              if (iVar2 != 1) {
                __assert_fail("status == l_False",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbFunc.c"
                              ,0x51a,
                              "Vec_Int_t *Acb_DerivePatchSupport(Cnf_Dat_t *, int, int, int, Vec_Int_t *, Acb_Ntk_t *, Vec_Int_t *, int)"
                             );
              }
              puts("ECO does not exist.");
              sat_solver_delete(s);
              Vec_IntFree(pVec);
              bVar1 = false;
            }
          }
          if (!bVar1) {
            return (Vec_Int_t *)0x0;
          }
        }
        sat_solver_delete(psVar5);
        if (pVVar3 != (Vec_Int_t *)0x0) {
          qsort(pVVar3->pArray,(long)pVVar3->nSize,4,Vec_IntSortCompare1);
          return pVVar3;
        }
        return (Vec_Int_t *)0x0;
      }
    }
  }
LAB_00397b42:
  __assert_fail("Var >= 0 && !(c >> 1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                ,0x12e,"int Abc_Var2Lit(int, int)");
}

Assistant:

Vec_Int_t * Acb_DerivePatchSupport( Cnf_Dat_t * pCnf, int iTar, int nTargets, int nCoDivs, Vec_Int_t * vDivs, Acb_Ntk_t * pNtkF, Vec_Int_t * vSuppOld, int TimeOut )
{
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    int i, Lit;
    int iCoVarBeg = 1;
    int iCiVarBeg = pCnf->nVars - nTargets;
    sat_solver * pSat = sat_solver_new();
    sat_solver_setnvars( pSat, 2 * pCnf->nVars + nCoDivs );
    // add clauses
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            return NULL;
    // add output clause
    Lit = Abc_Var2Lit( iCoVarBeg, 0 );
    if ( !sat_solver_addclause( pSat, &Lit, &Lit+1 ) )
        return NULL;
    // add clauses
    pCnf->pMan = NULL;
    Cnf_DataLift( pCnf, pCnf->nVars );
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            return NULL;
    Cnf_DataLift( pCnf, -pCnf->nVars );
    // add output clause
    Lit = Abc_Var2Lit( iCoVarBeg+pCnf->nVars, 0 );
    if ( !sat_solver_addclause( pSat, &Lit, &Lit+1 ) )
        return NULL;
    // create XORs for targets
    // add negative literal
    Lit = Abc_Var2Lit( iCiVarBeg + iTar, 1 );
    if ( !sat_solver_addclause( pSat, &Lit, &Lit+1 ) )
        return NULL;
    // add positive literal
    Lit = Abc_Var2Lit( iCiVarBeg+pCnf->nVars + iTar, 0 );
    if ( !sat_solver_addclause( pSat, &Lit, &Lit+1 ) )
        return NULL;
    // create XORs for divisors
    if ( nCoDivs > 0 )
    {
        abctime clk = Abc_Clock();
        int fUseMinAssump = 1;
        int iLit, nSuppNew, status;
        int iDivVar = 2 * pCnf->nVars;
        int pLits[2];
        int j = 0, iDivOld;
        Vec_IntClear( vSupp );
        if ( vSuppOld )
        {
            // start with predefined support
            Vec_IntForEachEntry( vSuppOld, iDivOld, j )
            {
                int iVar0 = iCoVarBeg+1+iDivOld;
                int iVar1 = iCoVarBeg+1+iDivOld+pCnf->nVars;
                //printf( "Selecting predefined divisor %d with weight %d\n", 
                //    iDivOld, Vec_IntEntry(&pNtkF->vObjWeight, Vec_IntEntry(vDivs, iDivOld)) );
                // add equality clauses
                pLits[0] = Abc_Var2Lit( iVar0, 0 );
                pLits[1] = Abc_Var2Lit( iVar1, 1 );
                if ( !sat_solver_addclause( pSat, pLits, pLits+2 ) )
                {
                    printf( "Unsat is detected earlier.\n" );
                    status = l_False;
                    break;
                }
                pLits[0] = Abc_Var2Lit( iVar0, 1 );
                pLits[1] = Abc_Var2Lit( iVar1, 0 );
                if ( !sat_solver_addclause( pSat, pLits, pLits+2 ) )
                {
                    printf( "Unsat is detected earlier.\n" );
                    status = l_False;
                    break;
                }
            }
        }
        if ( vSuppOld == NULL || j == Vec_IntSize(vSuppOld) )
        {
            for ( i = 0; i < nCoDivs; i++ )
            {
                sat_solver_add_xor( pSat, iDivVar+i, iCoVarBeg+1+i, iCoVarBeg+1+i+pCnf->nVars, 0 );
                Vec_IntPush( vSupp, Abc_Var2Lit(iDivVar+i, 1) );
            }
            // try one run
            if ( TimeOut ) sat_solver_set_runtime_limit( pSat, TimeOut * CLOCKS_PER_SEC + Abc_Clock() );
            status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
            if ( TimeOut ) sat_solver_set_runtime_limit( pSat, 0 );
            if ( status == l_True )
            {
                printf( "ECO does not exist.\n" );
                sat_solver_delete( pSat );
                Vec_IntFree( vSupp );
                return NULL;
            }
            if ( status == l_Undef )
            {
                printf( "Support computation timed out after %d sec.\n", TimeOut );
                sat_solver_delete( pSat );
                Vec_IntFree( vSupp );
                return NULL;
            }
            assert( status == l_False );
            printf( "Proved that the problem has a solution.  " );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            // find minimum subset
            if ( fUseMinAssump )
            {
                int fUseSuppMin = 1;
                // solve in a standard way
                abctime clk = Abc_Clock();
                nSuppNew = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp), 0 );
                Vec_IntShrink( vSupp, nSuppNew );
                Vec_IntSort( vSupp, 0 );
                printf( "Found one feasible set of %d divisors.  ", Vec_IntSize(vSupp) );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

                // perform minimization
                if ( fUseSuppMin && Vec_IntSize(vSupp) > 0 )
                {
                    abctime clk = Abc_Clock();
                    Vec_Int_t * vSupp2 = Vec_IntDup( vSupp );
                    Vec_Int_t * vTemp, * vWeights = Acb_DeriveWeights( vDivs, pNtkF );
                    vSupp = Acb_FindSupport( pSat, iDivVar, vWeights, vTemp = vSupp, TimeOut );
                    Vec_IntFree( vWeights );
                    Vec_IntFree( vTemp );
                    if ( vSupp == NULL )
                    {
                        printf( "Support minimization did not succeed.  " );
                        //sat_solver_delete( pSat );
                        vSupp = vSupp2;
                    }
                    else
                    {
                        Vec_IntFree( vSupp2 );
                        printf( "Minimized support to %d supp vars.  ", Vec_IntSize(vSupp) );
                    }
                    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
                }
            }
            else
            {
                int * pFinal, nFinal = sat_solver_final( pSat, &pFinal );
                printf( "AnalyzeFinal returned %d (out of %d).\n", nFinal, Vec_IntSize(vSupp) );
                Vec_IntClear( vSupp ); 
                for ( i = 0; i < nFinal; i++ )
                    Vec_IntPush( vSupp, Abc_LitNot(pFinal[i]) );
                // try one run
                status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
                assert( status == l_False );
                // try again
                nFinal = sat_solver_final( pSat, &pFinal );
                printf( "AnalyzeFinal returned %d (out of %d).\n", nFinal, Vec_IntSize(vSupp) );
            }
            // remap them into numbers
            Vec_IntForEachEntry( vSupp, iLit, i )
                Vec_IntWriteEntry( vSupp, i, Abc_Lit2Var(iLit)-iDivVar );
            Vec_IntSort( vSupp, 0 );
        }
    }
    sat_solver_delete( pSat );
    if ( vSupp ) Vec_IntSort( vSupp, 0 );
    return vSupp;
}